

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::PlatformIsAppleSimulator(cmMakefile *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  AppleSDK AVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  initializer_list<cmMakefile::AppleSDK> __l;
  allocator_type local_4a;
  less<cmMakefile::AppleSDK> local_49;
  _Rb_tree<cmMakefile::AppleSDK,_cmMakefile::AppleSDK,_std::_Identity<cmMakefile::AppleSDK>,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  local_48;
  AppleSDK local_18 [4];
  
  local_18[0] = AppleTVSimulator;
  local_18[1] = IPhoneSimulator;
  local_18[2] = WatchSimulator;
  local_18[3] = XRSimulator;
  __l._M_len = 4;
  __l._M_array = local_18;
  std::
  set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  ::set((set<cmMakefile::AppleSDK,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
         *)&local_48,__l,&local_49,&local_4a);
  AVar3 = GetAppleSDKType(this);
  p_Var1 = &local_48._M_impl.super__Rb_tree_header;
  p_Var6 = &p_Var1->_M_header;
  p_Var7 = &p_Var1->_M_header;
  if (local_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    do {
      p_Var4 = local_48._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = p_Var6;
      _Var2 = p_Var4[1]._M_color;
      p_Var6 = p_Var4;
      if ((int)_Var2 < (int)AVar3) {
        p_Var6 = p_Var5;
      }
      local_48._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&p_Var4->_M_left)[(int)_Var2 < (int)AVar3];
    } while ((&p_Var4->_M_left)[(int)_Var2 < (int)AVar3] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      if ((int)_Var2 < (int)AVar3) {
        p_Var4 = p_Var5;
      }
      p_Var7 = p_Var6;
      if ((int)AVar3 < (int)p_Var4[1]._M_color) {
        p_Var7 = &p_Var1->_M_header;
      }
    }
  }
  std::
  _Rb_tree<cmMakefile::AppleSDK,_cmMakefile::AppleSDK,_std::_Identity<cmMakefile::AppleSDK>,_std::less<cmMakefile::AppleSDK>,_std::allocator<cmMakefile::AppleSDK>_>
  ::~_Rb_tree(&local_48);
  return (_Rb_tree_header *)p_Var7 != p_Var1;
}

Assistant:

bool cmMakefile::PlatformIsAppleSimulator() const
{
  return std::set<AppleSDK>{
    AppleSDK::AppleTVSimulator,
    AppleSDK::IPhoneSimulator,
    AppleSDK::WatchSimulator,
    AppleSDK::XRSimulator,
  }
    .count(this->GetAppleSDKType());
}